

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_2_5::minEigenVector<Imath_2_5::Matrix44<double>,Imath_2_5::Vec4<double>>
               (Matrix44<double> *A,Vec4<double> *V)

{
  int iVar1;
  uint i;
  long lVar2;
  int iVar3;
  Vec4<double> S;
  Matrix44<double> MV;
  
  MV.x[1][2] = 0.0;
  MV.x[2][1] = 0.0;
  MV.x[3][1] = 0.0;
  MV.x[3][2] = 0.0;
  MV.x[2][3] = 0.0;
  MV.x[3][0] = 0.0;
  MV.x[1][3] = 0.0;
  MV.x[2][0] = 0.0;
  MV.x[0][3] = 0.0;
  MV.x[1][0] = 0.0;
  MV.x[0][1] = 0.0;
  MV.x[0][2] = 0.0;
  MV.x[0][0] = 1.0;
  MV.x[1][1] = 1.0;
  MV.x[2][2] = 1.0;
  MV.x[3][3] = 1.0;
  jacobiEigenSolver<double>(A,&S,&MV);
  iVar3 = 0;
  for (lVar2 = 1; lVar2 != 4; lVar2 = lVar2 + 1) {
    iVar1 = (int)lVar2;
    if (ABS(*(double *)((long)(MV.x + -1) + (long)iVar3 * 8)) <=
        ABS(*(double *)((long)(MV.x + -1) + lVar2 * 8))) {
      iVar1 = iVar3;
    }
    iVar3 = iVar1;
  }
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
    *(undefined8 *)((long)&V->x + lVar2) =
         *(undefined8 *)((long)MV.x[0] + lVar2 * 4 + (long)iVar3 * 8);
  }
  return;
}

Assistant:

void
minEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver(A, S, MV);

    int minIdx(0);
    for(unsigned int i = 1; i < TV::dimensions(); ++i)
    {
        if(std::abs(S[i]) < std::abs(S[minIdx]))
            minIdx = i;
    }

   for(unsigned int i = 0; i < TV::dimensions(); ++i)
        V[i] = MV[i][minIdx];
}